

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O3

void list_store_get(t_list_store *x,float f1,float f2)

{
  undefined8 *puVar1;
  int iVar2;
  _outlet *p_Var3;
  word wVar4;
  t_atom *argv;
  long lVar5;
  t_atom *ptVar6;
  ulong uVar7;
  uint argc;
  t_atom *ptVar8;
  uint onset;
  ulong uVar9;
  t_symbol *aptStack_680 [199];
  undefined1 local_48 [8];
  t_alist y;
  
  ptVar8 = (t_atom *)local_48;
  onset = (uint)f1;
  argc = (uint)f2;
  if (argc == 0) {
    argc = 1;
  }
  else if (((int)argc < 0) &&
          (iVar2 = (x->x_alist).l_n, argc = iVar2 - onset, argc == 0 || iVar2 < (int)onset))
  goto LAB_00184361;
  if ((-1 < (int)onset) && ((int)(argc + onset) <= (x->x_alist).l_n)) {
    uVar9 = (ulong)argc;
    if (argc < 100) {
      ptVar8 = (t_atom *)(local_48 + -(ulong)(argc << 4));
      argv = ptVar8;
    }
    else {
      argv = (t_atom *)getbytes(uVar9 << 4);
    }
    if ((x->x_alist).l_npointer == 0) {
      lVar5 = (ulong)onset * 0x28;
      ptVar6 = argv;
      uVar7 = uVar9;
      do {
        puVar1 = (undefined8 *)((long)&(((x->x_alist).l_vec)->l_a).a_type + lVar5);
        wVar4 = *(word *)(puVar1 + 1);
        *(undefined8 *)ptVar6 = *puVar1;
        ptVar6->a_w = wVar4;
        lVar5 = lVar5 + 0x28;
        ptVar6 = ptVar6 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      p_Var3 = x->x_out1;
      ptVar8[-1].a_w.w_symbol = (t_symbol *)0x184437;
      outlet_list(p_Var3,&s_list,argc,argv);
    }
    else {
      ptVar8[-1].a_w.w_symbol = (t_symbol *)0x1843b8;
      alist_clone(&x->x_alist,(t_alist *)local_48,onset,argc);
      ptVar6 = argv;
      uVar7 = uVar9;
      do {
        wVar4 = *(word *)(y._8_8_ + 8);
        *(undefined8 *)ptVar6 = *(undefined8 *)y._8_8_;
        ptVar6->a_w = wVar4;
        y._8_8_ = y._8_8_ + 0x28;
        ptVar6 = ptVar6 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      p_Var3 = x->x_out1;
      ptVar8[-1].a_w.w_symbol = (t_symbol *)0x1843ee;
      outlet_list(p_Var3,&s_list,argc,argv);
      ptVar8[-1].a_w.w_symbol = (t_symbol *)0x1843f7;
      alist_clear((t_alist *)local_48);
    }
    if (99 < argc) {
      ptVar8[-1].a_w.w_symbol = (t_symbol *)0x18444b;
      freebytes(argv,uVar9 << 4);
    }
    return;
  }
LAB_00184361:
  outlet_bang(x->x_out2);
  return;
}

Assistant:

static void list_store_get(t_list_store *x, float f1, float f2)
{
    t_atom *outv;
    int onset = f1, outc = f2;
    if (!outc)
        outc = 1; /* default */
    else if (outc < 0)
    {
        outc = x->x_alist.l_n - onset; /* till the end of the list */
        if (outc <= 0) /* onset out of range */
        {
            outlet_bang(x->x_out2);
            return;
        }
    }
    if (onset < 0 || (onset + outc > x->x_alist.l_n))
    {
        outlet_bang(x->x_out2);
        return;
    }
    ATOMS_ALLOCA(outv, outc);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, onset, outc);
        alist_toatoms(&y, outv, 0, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv, onset, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}